

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcoflow.c
# Opt level: O0

DLword gc_handleoverflow(DLword arg)

{
  DLword *pDVar1;
  uint uVar2;
  LispPTR addr;
  LispPTR cellcnt;
  dtd *ptr;
  htoverflow *cell;
  DLword arg_local;
  
  for (ptr = (dtd *)HToverflow; pDVar1 = DTDspace, uVar2 = *(uint *)ptr & 0xfffffff, uVar2 != 0;
      ptr = (dtd *)&ptr->dtd_size) {
    if (((*(ushort *)((ulong)(MDStypetbl + (uVar2 >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar2,*(uint *)ptr >> 0x1c);
    }
    *(uint *)ptr = *(uint *)ptr & 0xf0000000;
    *(uint *)ptr = *(uint *)ptr & 0xfffffff;
  }
  uVar2 = (uint)DTDspace[0x5d];
  if (0x400 < uVar2) {
    if (*Reclaim_cnt_word != 0) {
      if (uVar2 < *Reclaim_cnt_word) {
        *Reclaim_cnt_word = *Reclaim_cnt_word - uVar2;
      }
      else {
        *Reclaim_cnt_word = 0;
        doreclaim();
      }
    }
    *(uint *)(pDVar1 + 0x66) = uVar2 + *(int *)(pDVar1 + 0x66);
    pDVar1[0x5d] = 0;
  }
  return arg;
}

Assistant:

DLword gc_handleoverflow(DLword arg) {
  struct htoverflow *cell;
  struct dtd *ptr;
  LispPTR cellcnt;
  LispPTR addr;
  cell = (struct htoverflow *)HToverflow;
  /* This proc. protected from interrupt */
  while ((addr = cell->ptr) != NIL) {
    REC_GCLOOKUP(addr, cell->pcase);
    cell->ptr = 0;
    cell->pcase = 0;
    ++cell; /* (\ADDBASE CELL WORDSPERCELL) */
  }
  ptr = (struct dtd *)GetDTD(TYPE_LISTP);
  /* same as "extern struct dtd *ListpDTD" */
  if ((cellcnt = ptr->dtd_cnt0) > 1024) {
    Increment_Allocation_Count(cellcnt);
    ptr->dtd_oldcnt += cellcnt;
    ptr->dtd_cnt0 = 0;
  }
  return (arg);
}